

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O2

void __thiscall
ThreadedReplayer::compute_parents_depth<ThreadedReplayer::DeferredComputeInfo>
          (ThreadedReplayer *this,
          unordered_map<unsigned_long,_ThreadedReplayer::DeferredComputeInfo,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>_>
          *parents,unordered_map<unsigned_long,_unsigned_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>_>
                   *parents_depth,DeferredComputeInfo *info,uint32_t depth)

{
  mapped_type *pmVar1;
  VkPipelineLibraryCreateInfoKHR *pVVar2;
  size_type sVar3;
  mapped_type *info_00;
  uint32_t i;
  uint uVar4;
  ulong uVar5;
  DeferredComputeInfo *info_01;
  Hash parent;
  VkPipeline local_38;
  
  info_01 = (DeferredComputeInfo *)&info->hash;
  pmVar1 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)parents_depth,(key_type *)info_01);
  uVar4 = *pmVar1;
  if (*pmVar1 <= depth) {
    uVar4 = depth;
  }
  pmVar1 = std::__detail::
           _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)parents_depth,(key_type *)info_01);
  *pmVar1 = uVar4;
  pVVar2 = work_item_get_library_info<ThreadedReplayer::DeferredComputeInfo>
                     ((ThreadedReplayer *)info,info_01);
  if (pVVar2 != (VkPipelineLibraryCreateInfoKHR *)0x0) {
    for (uVar5 = 0; uVar5 < pVVar2->libraryCount; uVar5 = uVar5 + 1) {
      local_38 = pVVar2->pLibraries[uVar5];
      sVar3 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count(&parents->_M_h,(key_type *)&local_38);
      if (sVar3 != 0) {
        pmVar1 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       *)parents_depth,(key_type *)&local_38);
        if (*pmVar1 <= depth) {
          info_00 = std::__detail::
                    _Map_base<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>,_std::allocator<std::pair<const_unsigned_long,_ThreadedReplayer::DeferredComputeInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)parents,(key_type *)&local_38);
          compute_parents_depth<ThreadedReplayer::DeferredComputeInfo>
                    (this,parents,parents_depth,info_00,depth + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void compute_parents_depth(const unordered_map<Hash, DerivedInfo> &parents,
	                           unordered_map<Hash, uint32_t> &parents_depth,
	                           const DerivedInfo &info, uint32_t depth)
	{
		parents_depth[info.hash] = max(parents_depth.at(info.hash), depth);

		auto library = work_item_get_library_info(info);
		if (!library)
			return;

		for (uint32_t i = 0; i < library->libraryCount; i++)
		{
			Hash parent = (Hash)library->pLibraries[i];
			if (parents.count(parent) != 0 && parents_depth.at(parent) <= depth)
				compute_parents_depth(parents, parents_depth, parents.at(parent), depth + 1);
		}
	}